

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O0

SpatialForceVector *
iDynTree::transformWrenchEfficient<iDynTree::SpatialForceVector>
          (Transform *op1,SpatialForceVector *op2)

{
  VectorFixSize<3U> *this;
  MatrixFixSize<3U,_3U> *this_00;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
  *this_01;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *other_00;
  LinearVector3T *this_02;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *other_01;
  long in_RDX;
  Transform *in_RSI;
  SpatialForceVector *in_RDI;
  Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> R;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> p;
  SpatialForceVector *ret;
  DenseBase<Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
  *in_stack_fffffffffffffe88;
  SpatialForceVector *in_stack_fffffffffffffe90;
  PointerArgType in_stack_fffffffffffffe98;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffea0;
  SpatialForceVector *this_03;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff30;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff38;
  
  this_03 = in_RDI;
  SpatialForceVector::SpatialForceVector(in_stack_fffffffffffffe90);
  this = &Transform::getPosition(in_RSI)->super_Vector3;
  VectorFixSize<3U>::data(this);
  Eigen::Stride<0,_0>::Stride((Stride<0,_0> *)in_stack_fffffffffffffe90);
  Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)
             in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             (Stride<0,_0> *)in_stack_fffffffffffffe90);
  this_00 = &Transform::getRotation(in_RSI)->super_Matrix3x3;
  other = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)MatrixFixSize<3U,_3U>::data(this_00);
  Eigen::Stride<0,_0>::Stride((Stride<0,_0> *)in_stack_fffffffffffffe90);
  Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)
             in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             (Stride<0,_0> *)in_stack_fffffffffffffe90);
  this_01 = (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
             *)SpatialVector<iDynTree::SpatialForceVector>::getLinearVec3
                         ((SpatialVector<iDynTree::SpatialForceVector> *)(in_RDX + 8));
  toEigen<3U>((VectorFixSize<3U> *)this_01);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>>::
  operator*(this_01,in_stack_fffffffffffffea0);
  other_00 = (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)SpatialVector<iDynTree::SpatialForceVector>::getLinearVec3
                          (&this_03->super_SpatialVector<iDynTree::SpatialForceVector>);
  toEigen<3U>((VectorFixSize<3U> *)this_01);
  Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)
             in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  SpatialVector<iDynTree::SpatialForceVector>::getAngularVec3
            ((SpatialVector<iDynTree::SpatialForceVector> *)(in_RDX + 8));
  toEigen<3U>((VectorFixSize<3U> *)this_01);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>>::
  operator*(this_01,other_00);
  this_02 = SpatialVector<iDynTree::SpatialForceVector>::getLinearVec3
                      (&this_03->super_SpatialVector<iDynTree::SpatialForceVector>);
  toEigen<3U>((VectorFixSize<3U> *)this_01);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>::
  cross<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>,0>>
  ::operator+((MatrixBase<Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
               *)this_03,other);
  other_01 = (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)SpatialVector<iDynTree::SpatialForceVector>::getAngularVec3
                          (&this_03->super_SpatialVector<iDynTree::SpatialForceVector>);
  toEigen<3U>((VectorFixSize<3U> *)this_01);
  Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)this_02,other_01)
  ;
  return in_RDI;
}

Assistant:

spatialForceType transformWrenchEfficient(const Transform& op1, const spatialForceType& op2)
    {
        spatialForceType ret;

        Eigen::Map<const Eigen::Vector3d> p(op1.getPosition().data());
        Eigen::Map<const Eigen::Matrix<double,3,3,Eigen::RowMajor> > R(op1.getRotation().data());

        toEigen(ret.getLinearVec3()) = R*toEigen(op2.getLinearVec3());
        toEigen(ret.getAngularVec3())  = R*toEigen(op2.getAngularVec3()) + p.cross(toEigen(ret.getLinearVec3()));

        return ret;
    }